

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggasolver.cpp
# Opt level: O1

int __thiscall GGASolver::findHeadChanges(GGASolver *this)

{
  double dVar1;
  pointer pdVar2;
  MatrixSolver *pMVar3;
  int iVar4;
  Node *pNVar5;
  long lVar6;
  
  setMatrixCoeffs(this);
  pdVar2 = (this->dH).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (this->super_HydSolver).matrixSolver;
  iVar4 = (*pMVar3->_vptr_MatrixSolver[0xc])(pMVar3,(ulong)(uint)this->nodeCount,pdVar2);
  if ((iVar4 < 0) && (iVar4 = -1, 0 < this->nodeCount)) {
    lVar6 = 0;
    do {
      dVar1 = pdVar2[lVar6];
      pNVar5 = Network::node((this->super_HydSolver).network,(int)lVar6);
      (this->dH).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar6] = dVar1 - pNVar5->head;
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->nodeCount);
  }
  return iVar4;
}

Assistant:

int GGASolver::findHeadChanges()
{
    // ... setup the coeff. matrix of the GGA linearized system

    setMatrixCoeffs();

    // ... temporarily use the head change array dH[] to store new heads

    double *h = &dH[0];

    // ... solve the linearized GGA system for new nodal heads
    //     (matrixSolver returns a negative integer if it runs successfully;
    //      otherwise it returns the index of the row that caused it to fail.)

    int errorCode = matrixSolver->solve(nodeCount, h);
    if ( errorCode >= 0 ) return errorCode;

    // ... save new heads as head changes

    for (int i = 0; i < nodeCount; i++)
    {
        dH[i] = h[i] - network->node(i)->head;
    }

    // ... return a negative number indicating that
    //     the matrix solver ran successfully

     return -1;
}